

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,CallSiteInfo *callSiteInfo,uint count)

{
  uint uVar1;
  Type TVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined4 *puVar6;
  char16_t *pcVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char local_148 [8];
  char returnTypeStr [256];
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    returnTypeStr._248_8_ = ZEXT48(count);
    for (uVar9 = 0; uVar4 = returnTypeStr._248_8_, uVar9 != returnTypeStr._248_8_; uVar9 = uVar9 + 1
        ) {
      if (uVar9 == 0) {
        uVar10 = 0;
        pcVar7 = L" ";
      }
      else {
        pcVar7 = L" ";
        if ((int)((uVar9 & 0xffffffff) % 10) == 0) {
          pcVar7 = L"\n                          ";
        }
        uVar10 = uVar9 & 0xffffffff;
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",uVar10);
      if (*(short *)&callSiteInfo[uVar9].field_0x2 < 0) {
        Output::Print(L" poly");
        for (lVar8 = -0x10; lVar8 != 0; lVar8 = lVar8 + 4) {
          if (*(int *)((long)callSiteInfo[uVar9].u + 0x10 + lVar8) != -4) {
            Output::Print(L" %4d:%4d",(ulong)*(uint *)((long)callSiteInfo[uVar9].u + 0x20 + lVar8));
          }
        }
      }
      else {
        uVar1 = callSiteInfo[uVar9].u.functionData.sourceId;
        if (uVar1 == 0xfffffffc) {
          TVar2 = callSiteInfo[uVar9].u.functionData.functionId;
          if (TVar2 == 0xfffffffd) {
            pcVar7 = L"  !fn";
          }
          else if (TVar2 == 0xfffffffe) {
            pcVar7 = L"    x";
          }
          else {
            if (TVar2 != 0xffffffff) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                          ,0x65b,"(false)","false");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar6 = 0;
              goto LAB_00889553;
            }
            pcVar7 = L"  mix";
          }
LAB_008894d2:
          Output::Print(pcVar7);
        }
        else if (uVar1 == 0xfffffffe) {
          Output::Print(L" b%03d",(ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
        else {
          if (uVar1 == 0xffffffff) {
            pcVar7 = L" ????";
            goto LAB_008894d2;
          }
          Output::Print(L" %4d:%4d",(ulong)uVar1,
                        (ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
      }
LAB_00889553:
    }
    Output::Print(L"\n");
    Output::Print(L"    %-16s(%2d):",L"Callsite RetType",(ulong)count);
    uVar9 = 0;
    while( true ) {
      if (uVar4 == uVar9) break;
      if (uVar9 == 0) {
        uVar10 = 0;
        pcVar7 = L" ";
      }
      else {
        pcVar7 = L"\n                          ";
        if ((int)((uVar9 & 0xffffffff) / 10) * -10 + (int)uVar9 != 0) {
          pcVar7 = L" ";
        }
        uVar10 = uVar9 & 0xffffffff;
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",uVar10);
      ValueType::ToString(&callSiteInfo->returnType,(char (*) [256])local_148);
      Output::Print(L"  %S",(char (*) [256])local_148);
      uVar9 = uVar9 + 1;
      callSiteInfo = callSiteInfo + 1;
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, CallSiteInfo * callSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                if (!callSiteInfo[i].isPolymorphic)
                {
                    switch (callSiteInfo[i].u.functionData.sourceId)
                    {
                    case NoSourceId:
                        Output::Print(_u(" ????"));
                        break;

                    case BuiltInSourceId:
                        Output::Print(_u(" b%03d"), callSiteInfo[i].u.functionData.functionId);
                        break;

                    case InvalidSourceId:
                        if (callSiteInfo[i].u.functionData.functionId == CallSiteMixed)
                        {
                            Output::Print(_u("  mix"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteCrossContext)
                        {
                            Output::Print(_u("    x"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteNonFunction)
                        {
                            Output::Print(_u("  !fn"));
                        }
                        else
                        {
                            Assert(false);
                        }
                        break;

                    default:
                        Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.functionData.sourceId, callSiteInfo[i].u.functionData.functionId);
                        break;
                    };
                }
                else
                {
                    Output::Print(_u(" poly"));
                    for (int j = 0; j < DynamicProfileInfo::maxPolymorphicInliningSize; j++)
                    {
                        if (callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j] != CallSiteNoInfo)
                        {
                            Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.polymorphicCallSiteInfo->sourceIds[j], callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j]);
                        }
                    }
                }
            }
            Output::Print(_u("\n"));

            Output::Print(_u("    %-16s(%2d):"), _u("Callsite RetType"), count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char returnTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                callSiteInfo[i].returnType.ToString(returnTypeStr);
                Output::Print(_u("  %S"), returnTypeStr);
            }
            Output::Print(_u("\n"));
        }
    }